

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastq_parser_test.cpp
# Opt level: O2

void __thiscall
bioparser::test::BioparserFastqTest_FormatError_Test::~BioparserFastqTest_FormatError_Test
          (BioparserFastqTest_FormatError_Test *this)

{
  BioparserFastqTest::~BioparserFastqTest(&this->super_BioparserFastqTest);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(BioparserFastqTest, FormatError) {
  Setup("sample.fasta");
  try {
    s = p->Parse(-1);
  } catch (std::invalid_argument& exception) {
    EXPECT_STREQ(
        exception.what(),
        "[bioparser::FastqParser] error: invalid file format");
  }
}